

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O0

string_view anon_unknown.dwarf_59f30e::JsonTypeToString(ValueType type)

{
  optional<(anonymous_namespace)::Args> errorPath;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> message;
  string_view sVar1;
  json_error *this;
  static_string_view sVar2;
  _Storage<(anonymous_namespace)::Args,_true> local_e0;
  undefined8 local_d0;
  string_view local_b8;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  iterator local_90;
  size_type local_88;
  size_t local_80;
  char *local_78;
  size_t local_70;
  char *local_68;
  size_t local_60;
  char *local_58;
  size_t local_50;
  char *local_48;
  size_t local_40;
  char *local_38;
  size_t local_30;
  char *local_28;
  ValueType local_1c;
  size_t sStack_18;
  ValueType type_local;
  char *local_10;
  
  local_1c = type;
  switch(type) {
  case nullValue:
    sVar2 = ::cm::operator____s("NULL",4);
    local_30 = sVar2.super_string_view._M_len;
    sStack_18 = local_30;
    local_28 = sVar2.super_string_view._M_str;
    local_10 = local_28;
    break;
  case intValue:
  case uintValue:
  case realValue:
    sVar2 = ::cm::operator____s("NUMBER",6);
    local_40 = sVar2.super_string_view._M_len;
    sStack_18 = local_40;
    local_38 = sVar2.super_string_view._M_str;
    local_10 = local_38;
    break;
  case stringValue:
    sVar2 = ::cm::operator____s("STRING",6);
    local_50 = sVar2.super_string_view._M_len;
    sStack_18 = local_50;
    local_48 = sVar2.super_string_view._M_str;
    local_10 = local_48;
    break;
  case booleanValue:
    sVar2 = ::cm::operator____s("BOOLEAN",7);
    local_60 = sVar2.super_string_view._M_len;
    sStack_18 = local_60;
    local_58 = sVar2.super_string_view._M_str;
    local_10 = local_58;
    break;
  case arrayValue:
    sVar2 = ::cm::operator____s("ARRAY",5);
    local_70 = sVar2.super_string_view._M_len;
    sStack_18 = local_70;
    local_68 = sVar2.super_string_view._M_str;
    local_10 = local_68;
    break;
  case objectValue:
    sVar2 = ::cm::operator____s("OBJECT",6);
    local_80 = sVar2.super_string_view._M_len;
    sStack_18 = local_80;
    local_78 = sVar2.super_string_view._M_str;
    local_10 = local_78;
    break;
  default:
    this = (json_error *)__cxa_allocate_exception(0x28);
    local_b8 = (string_view)::cm::operator____s("invalid JSON type found",0x17);
    local_a8._M_len._0_4_ = (undefined4)local_b8._M_len;
    local_a8._M_len._4_4_ = local_b8._M_len._4_4_;
    local_a8._M_str._0_4_ = local_b8._M_str._0_4_;
    local_a8._M_str._4_4_ = local_b8._M_str._4_4_;
    local_90 = &local_a8;
    local_88 = 1;
    std::optional<(anonymous_namespace)::Args>::optional
              ((optional<(anonymous_namespace)::Args> *)&local_e0);
    message._M_len = local_88;
    message._M_array = local_90;
    errorPath.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
    super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
    super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .End._M_current =
         local_e0._M_value.
         super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         .End._M_current;
    errorPath.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
    super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
    super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .Begin._M_current =
         local_e0._M_value.
         super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         .Begin._M_current;
    errorPath.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
    super__Optional_payload_base<(anonymous_namespace)::Args>._16_8_ = local_d0;
    json_error::json_error(this,message,errorPath);
    __cxa_throw(this,&(anonymous_namespace)::json_error::typeinfo,json_error::~json_error);
  }
  sVar1._M_str = local_10;
  sVar1._M_len = sStack_18;
  return sVar1;
}

Assistant:

cm::string_view JsonTypeToString(Json::ValueType type)
{
  switch (type) {
    case Json::ValueType::nullValue:
      return "NULL"_s;
    case Json::ValueType::intValue:
    case Json::ValueType::uintValue:
    case Json::ValueType::realValue:
      return "NUMBER"_s;
    case Json::ValueType::stringValue:
      return "STRING"_s;
    case Json::ValueType::booleanValue:
      return "BOOLEAN"_s;
    case Json::ValueType::arrayValue:
      return "ARRAY"_s;
    case Json::ValueType::objectValue:
      return "OBJECT"_s;
  }
  throw json_error({ "invalid JSON type found"_s });
}